

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O0

void __thiscall ProfileHandler::UpdateTimer(ProfileHandler *this,bool enable)

{
  int local_4c;
  undefined1 auStack_38 [4];
  int interval_usec;
  itimerval timer;
  bool enable_local;
  ProfileHandler *this_local;
  
  if (((this->per_thread_timer_enabled_ & 1U) == 0) && (enable != (bool)(this->timer_running_ & 1U))
     ) {
    this->timer_running_ = enable;
    if (enable) {
      local_4c = (int)(1000000 / (long)this->frequency_);
    }
    else {
      local_4c = 0;
    }
    _auStack_38 = (long)(local_4c / 1000000);
    timer.it_interval.tv_sec = (__time_t)(local_4c % 1000000);
    timer.it_interval.tv_usec = _auStack_38;
    timer.it_value.tv_sec = timer.it_interval.tv_sec;
    timer.it_value.tv_usec._7_1_ = enable;
    setitimer(this->timer_type_,(itimerval *)auStack_38,(itimerval *)0x0);
  }
  return;
}

Assistant:

void ProfileHandler::UpdateTimer(bool enable) {
  if (per_thread_timer_enabled_) {
    // Ignore any attempts to disable it because that's not supported, and it's
    // always enabled so enabling is always a NOP.
    return;
  }

  if (enable == timer_running_) {
    return;
  }
  timer_running_ = enable;

  struct itimerval timer;
  static const int kMillion = 1000000;
  int interval_usec = enable ? kMillion / frequency_ : 0;
  timer.it_interval.tv_sec = interval_usec / kMillion;
  timer.it_interval.tv_usec = interval_usec % kMillion;
  timer.it_value = timer.it_interval;
  setitimer(timer_type_, &timer, 0);
}